

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::CmdBase::CmdBase
          (CmdBase *this,string *name,string *alternative,string *description,bool required,
          bool dominant,bool variadic)

{
  size_type sVar1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_51;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  byte local_40;
  allocator<char> local_3f;
  byte local_3e;
  allocator<char> local_3d [18];
  byte local_2b;
  byte local_2a;
  byte local_29;
  bool variadic_local;
  bool dominant_local;
  string *psStack_28;
  bool required_local;
  string *description_local;
  string *alternative_local;
  string *name_local;
  CmdBase *this_local;
  
  local_2b = variadic;
  this->_vptr_CmdBase = (_func_int **)&PTR__CmdBase_00161ac0;
  local_2a = dominant;
  local_29 = required;
  psStack_28 = description;
  description_local = alternative;
  alternative_local = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->name,name);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (alternative_local);
  local_3e = 0;
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    local_3e = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->command,"",local_3d);
  }
  else {
    std::operator+(&this->command,"-",alternative_local);
  }
  if ((local_3e & 1) != 0) {
    std::allocator<char>::~allocator(local_3d);
  }
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (description_local);
  local_40 = 0;
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    local_40 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->alternative,"",&local_3f);
  }
  else {
    std::operator+(&this->alternative,"--",description_local);
  }
  if ((local_40 & 1) != 0) {
    std::allocator<char>::~allocator(&local_3f);
  }
  std::__cxx11::string::string((string *)&this->description,psStack_28);
  this->required = (bool)(local_29 & 1);
  this->handled = false;
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_51);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->arguments,local_50,&local_51);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_51);
  this->dominant = (bool)(local_2a & 1);
  this->variadic = (bool)(local_2b & 1);
  return;
}

Assistant:

explicit CmdBase(const std::string& name, const std::string& alternative, const std::string& description, bool required, bool dominant, bool variadic) :
				name(name),
				command(name.size() > 0 ? "-" + name : ""),
				alternative(alternative.size() > 0 ? "--" + alternative : ""),
				description(description),
				required(required),
				handled(false),
				arguments({}),
				dominant(dominant),
				variadic(variadic) {
			}